

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O1

ostream * operator<<(ostream *os,SequenceDistanceGraph *sdg)

{
  vector<Link,_std::allocator<Link>_> *pvVar1;
  Node *n;
  ostream *poVar2;
  pointer pNVar3;
  pointer pLVar4;
  vector<Link,_std::allocator<Link>_> *__range2;
  vector<Link,_std::allocator<Link>_> *__x;
  vector<Link,_std::allocator<Link>_> lv;
  vector<Link,_std::allocator<Link>_> local_48;
  
  pvVar1 = (sdg->super_DistanceGraph).links.
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (sdg->super_DistanceGraph).links.
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<Link,_std::allocator<Link>_>::vector(&local_48,__x);
    for (pLVar4 = local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar4 != local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_finish; pLVar4 = pLVar4 + 1) {
    }
    if (local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"SequenceDistanceGraph ",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(sdg->super_DistanceGraph).name._M_dataplus._M_p,
                      (sdg->super_DistanceGraph).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  for (pNVar3 = (sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar3 != (sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_finish; pNVar3 = pNVar3 + 1) {
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes, ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," links",6);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraph &sdg) {
    uint64_t linkcount = 0;
    for (auto lv:sdg.links)
        for (auto l:lv)
            if (llabs(l.source) <= llabs(l.dest)) ++linkcount;

    os <<"SequenceDistanceGraph " << sdg.name <<": "<< sdg.count_active_nodes() <<" nodes, " << linkcount << " links";
    return os;
}